

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O0

void __thiscall idx2::free_list_allocator::DeallocAll(free_list_allocator *this)

{
  node *local_50;
  buffer Buf;
  node *Next;
  free_list_allocator *this_local;
  
  while (this->Head != (node *)0x0) {
    Buf.Alloc = (allocator *)this->Head->Next;
    local_50 = this->Head;
    Buf.Data = (byte *)this->MaxBytes;
    Buf.Bytes = (i64)this->Parent;
    (*this->Parent->_vptr_allocator[1])(this->Parent,&local_50);
    this->Head = (node *)Buf.Alloc;
  }
  return;
}

Assistant:

void
free_list_allocator::DeallocAll()
{
  idx2_Assert(Parent);
  while (Head)
  {
    node* Next = Head->Next;
    buffer Buf((byte*)Head, MaxBytes, Parent);
    Parent->Dealloc(&Buf);
    Head = Next;
  }
}